

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

int duckdb::Terminal::HasMoreData(int fd)

{
  int iVar1;
  int in_EDI;
  timeval tv;
  fd_set *__arr;
  uint __i;
  fd_set rfds;
  timeval local_a8;
  fd_set *local_98;
  uint local_8c;
  fd_set local_88;
  
  local_98 = &local_88;
  for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 1) {
    local_98->fds_bits[local_8c] = 0;
  }
  local_88.fds_bits[in_EDI / 0x40] =
       1L << ((byte)((long)in_EDI % 0x40) & 0x3f) | local_88.fds_bits[in_EDI / 0x40];
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  iVar1 = ::select(1,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  return iVar1;
}

Assistant:

int Terminal::HasMoreData(int fd) {
	fd_set rfds;
	FD_ZERO(&rfds);
	FD_SET(fd, &rfds);

	// no timeout: return immediately
	struct timeval tv;
	tv.tv_sec = 0;
	tv.tv_usec = 0;
	return select(1, &rfds, NULL, NULL, &tv);
}